

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteCHeader(CWriter *this)

{
  bool bVar1;
  Newline local_62;
  Newline local_61;
  string_view local_60;
  string_view local_48;
  Newline local_33;
  Newline local_32;
  Newline local_31;
  undefined1 local_30 [8];
  string guard;
  CWriter *this_local;
  
  guard.field_2._8_8_ = this;
  ReserveExportNames(this);
  this->stream_ = this->h_stream_;
  (anonymous_namespace)::CWriter::GenerateHeaderGuard_abi_cxx11_((string *)local_30,(CWriter *)this)
  ;
  (anonymous_namespace)::CWriter::Write<char_const(&)[40],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [40])"/* Automatically generated by wasm2c */",&local_31);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[9],std::__cxx11::string&,wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [9])"#ifndef ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,&local_32
            );
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[9],std::__cxx11::string&,wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [9])"#define ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,&local_33
            );
  Write(this);
  ComputeSimdScope(this);
  WriteHeaderIncludes(this);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,s_header_top);
  Write(this,local_48);
  Write(this);
  WriteModuleInstance(this);
  WriteInitDecl(this);
  WriteFreeDecl(this);
  WriteGetFuncTypeDecl(this);
  WriteMultivalueResultTypes(this);
  WriteImports(this);
  WriteImportProperties(this,Declarations);
  WriteExports(this,Declarations);
  bVar1 = Features::tail_call_enabled(&this->options_->features);
  if (bVar1) {
    WriteTailCallExports(this,Declarations);
  }
  Write(this);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_60,s_header_bottom);
  Write(this,local_60);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::Newline,char_const(&)[12],std::__cxx11::string&,char_const(&)[4],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,&local_61,(char (*) [12])"#endif  /* ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (char (*) [4])0x37c2f4,&local_62);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void CWriter::WriteCHeader() {
  ReserveExportNames();

  stream_ = h_stream_;
  std::string guard = GenerateHeaderGuard();
  Write("/* Automatically generated by wasm2c */", Newline());
  Write("#ifndef ", guard, Newline());
  Write("#define ", guard, Newline());
  Write(Newline());
  ComputeSimdScope();
  WriteHeaderIncludes();
  Write(s_header_top);
  Write(Newline());
  WriteModuleInstance();
  WriteInitDecl();
  WriteFreeDecl();
  WriteGetFuncTypeDecl();
  WriteMultivalueResultTypes();
  WriteImports();
  WriteImportProperties(CWriterPhase::Declarations);
  WriteExports(CWriterPhase::Declarations);
  if (options_.features.tail_call_enabled()) {
    WriteTailCallExports(CWriterPhase::Declarations);
  }
  Write(Newline());
  Write(s_header_bottom);
  Write(Newline(), "#endif  /* ", guard, " */", Newline());
}